

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

void __thiscall
CECoordinates::CECoordinates
          (CECoordinates *this,vector<double,_std::allocator<double>_> *xcoord,
          vector<double,_std::allocator<double>_> *ycoord,CECoordinateType *coord_type)

{
  int *in_RCX;
  CEAngle *in_RDI;
  CECoordinateType *coord_type_00;
  CEAngle y;
  CEAngle x;
  CEAngle *in_stack_ffffffffffffff58;
  CEAngle *this_00;
  CECoordinates *this_01;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  
  in_RDI->_vptr_CEAngle = (_func_int **)&PTR__CECoordinates_00179728;
  this_00 = (CEAngle *)&in_RDI->angle_;
  CEAngle::CEAngle((CEAngle *)0x149efc);
  this_01 = (CECoordinates *)&in_RDI[1].angle_;
  CEAngle::CEAngle((CEAngle *)0x149f0f);
  init_members(this_01);
  CEAngle::CEAngle((CEAngle *)0x149f27);
  if ((*in_RCX == 2) || (*in_RCX == 3)) {
    CEAngle::Dms(in_stack_ffffffffffffff78);
    CEAngle::operator=(this_00,in_stack_ffffffffffffff58);
    CEAngle::~CEAngle((CEAngle *)0x149f76);
  }
  else {
    CEAngle::Hms(in_stack_ffffffffffffff78);
    CEAngle::operator=(this_00,in_stack_ffffffffffffff58);
    CEAngle::~CEAngle((CEAngle *)0x14a00c);
  }
  CEAngle::Dms(in_stack_ffffffffffffff78);
  coord_type_00 =
       (CECoordinateType *)CEAngle::operator_cast_to_double((CEAngle *)&stack0xffffffffffffff78);
  CEAngle::CEAngle((CEAngle *)this_01,(double *)in_RDI);
  CEAngle::~CEAngle((CEAngle *)0x14a079);
  SetCoordinates(this_01,in_RDI,this_00,coord_type_00);
  CEAngle::~CEAngle((CEAngle *)0x14a0a1);
  CEAngle::~CEAngle((CEAngle *)0x14a0ab);
  return;
}

Assistant:

CECoordinates::CECoordinates(const std::vector<double>& xcoord,
                             const std::vector<double>& ycoord,
                             const CECoordinateType& coord_type)
{
    init_members();
    CEAngle x;
    if ((coord_type == CECoordinateType::GALACTIC) || 
        (coord_type == CECoordinateType::OBSERVED)) {
        x = CEAngle::Dms(xcoord);
    } else {
        x = CEAngle::Hms(xcoord);
    }
    CEAngle y = CEAngle::Dms(ycoord);
    CECoordinates::SetCoordinates(x, y, coord_type);
}